

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

whisper_context *
whisper_init_from_buffer_with_params(void *buffer,size_t buffer_size,whisper_context_params params)

{
  whisper_context *ctx;
  whisper_state *pwVar1;
  
  ctx = whisper_init_from_buffer_with_params_no_state(buffer,buffer_size,params);
  if (ctx != (whisper_context *)0x0) {
    pwVar1 = whisper_init_state(ctx);
    ctx->state = pwVar1;
    if (pwVar1 != (whisper_state *)0x0) {
      return ctx;
    }
    whisper_free(ctx);
  }
  return (whisper_context *)0x0;
}

Assistant:

struct whisper_context * whisper_init_from_buffer_with_params(void * buffer, size_t buffer_size, struct whisper_context_params params) {
    whisper_context * ctx = whisper_init_from_buffer_with_params_no_state(buffer, buffer_size, params);
    if (!ctx) {
        return nullptr;
    }

    ctx->state = whisper_init_state(ctx);
    if (!ctx->state) {
        whisper_free(ctx);
        return nullptr;
    }

    return ctx;
}